

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O0

void Fra_FramesConstrainNode(Aig_Man_t *pManFraig,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p;
  Aig_Obj_t *p_00;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pObjReprNew;
  Aig_Obj_t *pObjRepr;
  Aig_Obj_t *pObjNew2;
  Aig_Obj_t *pObjNew;
  int iFrame_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pManFraig_local;
  
  pAVar2 = Fra_ClassObjRepr(pObj);
  if (pAVar2 != (Aig_Obj_t *)0x0) {
    if (pObj->Id <= pAVar2->Id) {
      __assert_fail("pObjRepr->Id < pObj->Id",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                    ,100,"void Fra_FramesConstrainNode(Aig_Man_t *, Aig_Obj_t *, int)");
    }
    p = Fra_ObjFraig(pObj,iFrame);
    p_00 = Fra_ObjFraig(pAVar2,iFrame);
    pAVar3 = Aig_Regular(p);
    pAVar4 = Aig_Regular(p_00);
    if (pAVar3 != pAVar4) {
      pAVar2 = Aig_NotCond(p_00,(uint)(*(ulong *)&pObj->field_0x18 >> 3) & 1 ^
                                (uint)(*(ulong *)&pAVar2->field_0x18 >> 3) & 1);
      Fra_ObjSetFraig(pObj,iFrame,pAVar2);
      pAVar2 = Aig_Exor(pManFraig,p,p_00);
      iVar1 = Aig_ObjPhaseReal(pAVar2);
      pAVar2 = Aig_NotCond(pAVar2,(uint)((iVar1 != 0 ^ 0xffU) & 1));
      iVar1 = Aig_ObjPhaseReal(pAVar2);
      if (iVar1 != 1) {
        __assert_fail("Aig_ObjPhaseReal(pMiter) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                      ,0x73,"void Fra_FramesConstrainNode(Aig_Man_t *, Aig_Obj_t *, int)");
      }
      Aig_ObjCreateCo(pManFraig,pAVar2);
    }
  }
  return;
}

Assistant:

static inline void Fra_FramesConstrainNode( Aig_Man_t * pManFraig, Aig_Obj_t * pObj, int iFrame )
{
    Aig_Obj_t * pObjNew, * pObjNew2, * pObjRepr, * pObjReprNew, * pMiter;
    // skip nodes without representative
    if ( (pObjRepr = Fra_ClassObjRepr(pObj)) == NULL )
        return;
    assert( pObjRepr->Id < pObj->Id );
    // get the new node 
    pObjNew = Fra_ObjFraig( pObj, iFrame );
    // get the new node of the representative
    pObjReprNew = Fra_ObjFraig( pObjRepr, iFrame );
    // if this is the same node, no need to add constraints
    if ( Aig_Regular(pObjNew) == Aig_Regular(pObjReprNew) )
        return;
    // these are different nodes - perform speculative reduction
    pObjNew2 = Aig_NotCond( pObjReprNew, pObj->fPhase ^ pObjRepr->fPhase );
    // set the new node
    Fra_ObjSetFraig( pObj, iFrame, pObjNew2 );
    // add the constraint
    pMiter = Aig_Exor( pManFraig, pObjNew, pObjReprNew );
    pMiter = Aig_NotCond( pMiter, !Aig_ObjPhaseReal(pMiter) );
    assert( Aig_ObjPhaseReal(pMiter) == 1 );
    Aig_ObjCreateCo( pManFraig, pMiter );
}